

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2TextureSharingTest::GLES2TextureSharingTest
          (GLES2TextureSharingTest *this,EglTestContext *eglTestCtx,char *name,char *desc,
          TestSpec *spec)

{
  TextureFormat local_18;
  
  GLES2SharingTest::GLES2SharingTest(&this->super_GLES2SharingTest,eglTestCtx,name,desc,spec);
  (this->super_GLES2SharingTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2TextureSharingTest_003d5a58;
  this->m_glTexture = 0;
  local_18.order = RGBA;
  local_18.type = UNORM_INT8;
  tcu::Texture2D::Texture2D(&this->m_texture,&local_18,1,1);
  return;
}

Assistant:

GLES2TextureSharingTest::GLES2TextureSharingTest (EglTestContext& eglTestCtx, const char* name, const char* desc, const GLES2SharingTest::TestSpec& spec)
	: GLES2SharingTest	(eglTestCtx, name, desc, spec)
	, m_glTexture		(0)
	, m_texture			(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), 1, 1)
{
}